

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O3

SpecparamDeclarationSyntax * __thiscall
slang::parsing::Parser::parseSpecparam(Parser *this,AttrList attr,SyntaxKind parentKind)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SourceLocation location;
  SpecparamDeclaratorSyntax *pSVar3;
  undefined4 extraout_var_00;
  SpecparamDeclarationSyntax *pSVar4;
  EVP_PKEY_CTX *src;
  Info *pIVar5;
  Info *extraout_RDX;
  Info *pIVar6;
  TokenKind kind;
  TokenKind TVar7;
  ulong uVar8;
  Token TVar9;
  Token TVar10;
  Token keyword;
  Token semi;
  VariableDimensionSyntax *dim;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  SmallVector<slang::syntax::VariableDimensionSyntax_*,_5UL> dims;
  Token current;
  Token local_1b0;
  ImplicitTypeSyntax *local_1a0;
  SyntaxFactory *local_198;
  Info *local_190;
  undefined8 local_188;
  pointer local_180;
  size_t local_178;
  VariableDimensionSyntax *local_170;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_168;
  ulong local_158;
  undefined8 uStack_150;
  size_t local_148;
  pointer local_140;
  size_t local_138;
  Token local_130;
  undefined1 local_120 [24];
  undefined1 auStack_108 [96];
  SmallVectorBase<slang::syntax::VariableDimensionSyntax_*> local_a8 [2];
  Token local_68;
  SyntaxNode *local_58;
  SyntaxNode *pSStack_50;
  pointer local_40;
  
  local_178 = (size_t)attr._M_extent._M_extent_value;
  local_180 = attr._M_ptr;
  TVar9 = ParserBase::consume(&this->super_ParserBase);
  local_190 = TVar9.info;
  local_188 = TVar9._0_8_;
  local_170 = parseDimension(this);
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 5;
  if (local_170 != (VariableDimensionSyntax *)0x0) {
    SmallVectorBase<slang::syntax::VariableDimensionSyntax*>::
    emplace_back<slang::syntax::VariableDimensionSyntax*const&>
              ((SmallVectorBase<slang::syntax::VariableDimensionSyntax*> *)local_a8,&local_170);
  }
  Token::Token(&local_130);
  iVar2 = SmallVectorBase<slang::syntax::VariableDimensionSyntax_*>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,src);
  auStack_108._16_8_ = CONCAT44(extraout_var,iVar2);
  local_120._8_4_ = SyntaxList;
  local_120._16_8_ = (SyntaxNode *)0x0;
  auStack_108._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  local_120._0_8_ = &PTR_getChild_005ae338;
  TVar9 = ParserBase::placeholderToken(&this->super_ParserBase);
  local_198 = &this->factory;
  local_1a0 = slang::syntax::SyntaxFactory::implicitType
                        (local_198,local_130,
                         (SyntaxList<slang::syntax::VariableDimensionSyntax> *)local_120,TVar9);
  Token::Token(&local_1b0);
  local_120._0_8_ = auStack_108;
  local_120._8_8_ = 0;
  local_120._16_8_ = (SyntaxNode *)0x4;
  TVar9 = ParserBase::peek(&this->super_ParserBase);
  local_68 = TVar9;
  bVar1 = slang::syntax::SyntaxFacts::isNotIdOrComma(TVar9.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      location = Token::location(&local_68);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x380005,location);
    }
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isIdentifierOrComma(TVar9.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar9,Semicolon,&local_1b0,(DiagCode)0x380005);
      pIVar6 = extraout_RDX;
      goto LAB_00305244;
    }
    do {
      do {
        pIVar6 = TVar9.info;
        pSVar3 = parseSpecparamDeclarator(this,parentKind);
        local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pSVar3;
        local_158 = CONCAT71(local_158._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_120,
                   (TokenOrSyntax *)&local_168._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isNotIdOrComma(TVar10.kind);
        if (TVar10.kind != Comma || bVar1) goto LAB_0030522d;
        local_168._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_158 = local_158 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_120,
                   (TokenOrSyntax *)&local_168._M_first);
        TVar10 = ParserBase::peek(&this->super_ParserBase);
        pIVar5 = TVar10.info;
        kind = TVar10.kind;
        bVar1 = slang::syntax::SyntaxFacts::isNotIdOrComma(kind);
        if (kind == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          goto LAB_0030522d;
        }
        TVar7 = TVar9.kind;
        uVar8 = TVar10._0_8_ & 0xffffffff;
        TVar9.info = pIVar5;
        TVar9.kind = (short)uVar8;
        TVar9._2_1_ = (char)(uVar8 >> 0x10);
        TVar9.numFlags.raw = (char)(uVar8 >> 0x18);
        TVar9.rawLen = (int)(uVar8 >> 0x20);
      } while (pIVar6 != pIVar5 || TVar7 != kind);
      bVar1 = ParserBase::
              skipBadTokens<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isNotIdOrComma>
                        (&this->super_ParserBase,(DiagCode)0x380005,true);
      uVar8 = TVar10._0_8_ & 0xffffffff;
      TVar9.kind = (short)uVar8;
      TVar9._2_1_ = (char)(uVar8 >> 0x10);
      TVar9.numFlags.raw = (char)(uVar8 >> 0x18);
      TVar9.rawLen = (int)(uVar8 >> 0x20);
    } while (bVar1);
  }
LAB_0030522d:
  local_1b0 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  pIVar6 = local_1b0.info;
LAB_00305244:
  local_168._8_4_ = 1;
  local_158 = 0;
  uStack_150 = 0;
  local_148 = local_178;
  local_140 = local_180;
  local_138 = local_178;
  local_168._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005b0da0;
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_120,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)pIVar6);
  local_40 = (pointer)CONCAT44(extraout_var_00,iVar2);
  local_68.info._0_4_ = 3;
  local_58 = (SyntaxNode *)0x0;
  pSStack_50 = (SyntaxNode *)0x0;
  local_68._0_8_ = &PTR_getChild_005b2100;
  keyword.info = local_190;
  keyword.kind = (undefined2)local_188;
  keyword._2_1_ = local_188._2_1_;
  keyword.numFlags.raw = local_188._3_1_;
  keyword.rawLen = local_188._4_4_;
  pSVar4 = slang::syntax::SyntaxFactory::specparamDeclaration
                     (local_198,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&local_168._M_first,
                      keyword,local_1a0,
                      (SeparatedSyntaxList<slang::syntax::SpecparamDeclaratorSyntax> *)&local_68,
                      local_1b0);
  if ((pointer)local_120._0_8_ != (pointer)auStack_108) {
    operator_delete((void *)local_120._0_8_);
  }
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pSVar4;
}

Assistant:

SpecparamDeclarationSyntax& Parser::parseSpecparam(AttrList attr, SyntaxKind parentKind) {
    auto keyword = consume();

    auto dim = parseDimension();
    SmallVector<VariableDimensionSyntax*> dims;
    if (dim)
        dims.push_back(dim);

    auto& type = factory.implicitType(Token(), dims.copy(alloc), placeholderToken());

    Token semi;
    SmallVector<TokenOrSyntax, 4> buffer;
    parseList<isIdentifierOrComma, isNotIdOrComma>(buffer, TokenKind::Semicolon, TokenKind::Comma,
                                                   semi, RequireItems::True,
                                                   diag::ExpectedDeclarator, [this, parentKind] {
                                                       return &parseSpecparamDeclarator(parentKind);
                                                   });

    return factory.specparamDeclaration(attr, keyword, type, buffer.copy(alloc), semi);
}